

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall
PrecomputedTransactionData::PrecomputedTransactionData<CTransaction>
          (PrecomputedTransactionData *this,CTransaction *txTo)

{
  PrecomputedTransactionData *in_RSI;
  long in_RDI;
  vector<CTxOut,_std::allocator<CTxOut>_> *this_00;
  long in_FS_OFFSET;
  uint256 *in_stack_ffffffffffffff88;
  undefined1 force;
  vector<CTxOut,_std::allocator<CTxOut>_> *in_stack_ffffffffffffffb8;
  CTransaction *in_stack_ffffffffffffffc0;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uint256::uint256(in_stack_ffffffffffffff88);
  uint256::uint256(in_stack_ffffffffffffff88);
  uint256::uint256(in_stack_ffffffffffffff88);
  uint256::uint256(in_stack_ffffffffffffff88);
  uint256::uint256(in_stack_ffffffffffffff88);
  *(undefined1 *)(in_RDI + 0xa0) = 0;
  uint256::uint256(in_stack_ffffffffffffff88);
  uint256::uint256(in_stack_ffffffffffffff88);
  uint256::uint256(in_stack_ffffffffffffff88);
  *(undefined1 *)(in_RDI + 0x101) = 0;
  this_00 = (vector<CTxOut,_std::allocator<CTxOut>_> *)(in_RDI + 0x108);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffff88);
  *(undefined1 *)(in_RDI + 0x120) = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 0;
  force = (undefined1)((ulong)&local_28 >> 0x38);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffff88);
  Init<CTransaction>(in_RSI,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(bool)force);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

PrecomputedTransactionData::PrecomputedTransactionData(const T& txTo)
{
    Init(txTo, {});
}